

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpAcceptor::TcpAcceptor(TcpAcceptor *this,io_context *io_context,endpoint *ep)

{
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *this_00;
  int __oflag;
  long in_RDI;
  TriggerVariable *this_01;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffff98;
  undefined1 active;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffb0;
  constraint_t<is_convertible<io_context_&,_execution_context_&>::value> cVar1;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *in_stack_ffffffffffffffc0;
  int local_28 [10];
  
  cVar1 = (constraint_t<is_convertible<io_context_&,_execution_context_&>::value>)
          ((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  std::enable_shared_from_this<gmlc::networking::TcpAcceptor>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpAcceptor> *)0x70c122);
  asio::ip::basic_endpoint<asio::ip::tcp>::basic_endpoint
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  active = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::
  basic_socket_acceptor<asio::io_context>
            (in_stack_ffffffffffffffc0,
             (io_context *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),cVar1);
  this_01 = (TriggerVariable *)(in_RDI + 0x88);
  std::
  function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
  ::function((function<void_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::shared_ptr<gmlc::networking::TcpConnection>)>
              *)this_01);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>::
  function((function<bool_(std::shared_ptr<gmlc::networking::TcpAcceptor>,_const_std::error_code_&)>
            *)this_01);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this_01);
  std::atomic<gmlc::networking::TcpAcceptor::AcceptingStates>::atomic
            ((atomic<gmlc::networking::TcpAcceptor::AcceptingStates> *)(in_RDI + 0xe8),OPENED);
  concurrency::TriggerVariable::TriggerVariable(this_01,(bool)active);
  this_00 = (basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor> *)(in_RDI + 0x30);
  local_28[0] = (int)asio::ip::basic_endpoint<asio::ip::tcp>::protocol
                               ((basic_endpoint<asio::ip::tcp> *)this_00);
  asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::open
            (this_00,(char *)local_28,__oflag);
  return;
}

Assistant:

TcpAcceptor::TcpAcceptor(asio::io_context& io_context, tcp::endpoint& ep) :
    endpoint_(ep), acceptor_(io_context)
{
    acceptor_.open(ep.protocol());
}